

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

bool __thiscall diligent_spirv_cross::Bitset::operator==(Bitset *this,Bitset *other)

{
  size_type sVar1;
  __node_base *p_Var2;
  bool bVar3;
  
  if ((this->lower == other->lower) &&
     ((this->higher)._M_h._M_element_count == (other->higher)._M_h._M_element_count)) {
    p_Var2 = &(this->higher)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      bVar3 = p_Var2 == (__node_base *)0x0;
      if (bVar3) {
        return bVar3;
      }
      sVar1 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(other->higher)._M_h,(key_type_conflict *)(p_Var2 + 1));
    } while (sVar1 != 0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool operator==(const Bitset &other) const
	{
		if (lower != other.lower)
			return false;

		if (higher.size() != other.higher.size())
			return false;

		for (auto &v : higher)
			if (other.higher.count(v) == 0)
				return false;

		return true;
	}